

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rng.c
# Opt level: O1

bool_t rngTestFIPS4(octet *buf)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  
  bVar3 = (bool)(*buf & 1);
  uVar1 = 1;
  uVar2 = 1;
  do {
    if (((buf[uVar1 >> 3] >> ((uint)uVar1 & 7) & 1) != 0) == bVar3) {
      uVar2 = uVar2 + 1;
    }
    else {
      if (0x19 < uVar2) {
        return 0;
      }
      bVar3 = bVar3 == false;
      uVar2 = 1;
    }
    uVar1 = uVar1 + 1;
  } while (uVar1 != 20000);
  return (bool_t)(uVar2 < 0x1a);
}

Assistant:

bool_t rngTestFIPS4(const octet buf[2500])
{
	octet b;
	size_t l;
	size_t i;
	ASSERT(memIsValid(buf, 2500));
	b = buf[0] & 1;
	l = 1;
	for (i = 1; i < 20000; ++i)
		if ((buf[i / 8] >> i % 8 & 1) == b)
			++l;
		else
		{
			if (l >= 26)
				return FALSE;
			b = !b, l = 1;
		}
	return l < 26;
}